

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrins.cpp
# Opt level: O0

long c_scan(long num,long degree,long res)

{
  float fVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  bool local_61;
  char *local_60;
  long d2;
  long d1;
  long dd;
  long d;
  float y;
  float x;
  long close_dist;
  float distance;
  int i;
  robot *cur_robot;
  long res_local;
  long degree_local;
  long num_local;
  
  local_61 = 3 < (ulong)num;
  if (local_61) {
    __assert_fail("num >= 0 && num <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/VladlenPopolitov[P]ForthScriptCpp/examples/ForthRobots/intrins.cpp"
                  ,0x1a,"long c_scan(long, long, long)");
  }
  _y = 0;
  if (res < 0) {
    cur_robot = (robot *)0x0;
  }
  else {
    cur_robot = (robot *)res;
    if (10 < res) {
      cur_robot = (robot *)0xa;
    }
  }
  res_local = degree;
  if (degree < 0) {
    res_local = -degree;
  }
  if (0x167 < res_local) {
    res_local = res_local % 0x168;
  }
  robots[num].scan = (int)res_local;
  for (close_dist._4_4_ = 0; (int)close_dist._4_4_ < 4; close_dist._4_4_ = close_dist._4_4_ + 1) {
    if ((robots + num != robots + (int)close_dist._4_4_) &&
       (robots[(int)close_dist._4_4_].status != 0)) {
      fVar4 = (float)(robots[num].x / 10 - robots[(int)close_dist._4_4_].x / 10);
      fVar5 = (float)(robots[num].y / 10 - robots[(int)close_dist._4_4_].y / 10);
      if ((int)(fVar4 + 0.5) == 0) {
        iVar2 = 0x10e;
        if (robots[num].y < robots[(int)close_dist._4_4_].y) {
          iVar2 = 0x5a;
        }
        dd = (long)iVar2;
      }
      else {
        if (robots[(int)close_dist._4_4_].y < robots[num].y) {
          if (robots[num].x < robots[(int)close_dist._4_4_].x) {
            dVar6 = std::atan((double)(ulong)(uint)(fVar5 / fVar4));
            fVar1 = SUB84(dVar6,0) * 57.29578 + 360.0;
          }
          else {
            dVar6 = std::atan((double)(ulong)(uint)(fVar5 / fVar4));
            fVar1 = SUB84(dVar6,0) * 57.29578 + 180.0;
          }
        }
        else if (robots[num].x < robots[(int)close_dist._4_4_].x) {
          dVar6 = std::atan((double)(ulong)(uint)(fVar5 / fVar4));
          fVar1 = SUB84(dVar6,0) * 57.29578;
        }
        else {
          dVar6 = std::atan((double)(ulong)(uint)(fVar5 / fVar4));
          fVar1 = SUB84(dVar6,0) * 57.29578 + 180.0;
        }
        dd = (long)fVar1;
      }
      if (((long)cur_robot < res_local) && (res_local < 0x168 - (long)cur_robot)) {
        d1 = res_local;
        d2 = dd - (long)cur_robot;
        lVar3 = dd;
      }
      else {
        d1 = res_local + 0xb4;
        d2 = (dd + 0xb4) - (long)cur_robot;
        lVar3 = dd + 0xb4;
      }
      local_60 = cur_robot->name + lVar3 + -4;
      if (r_debug != 0) {
        printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",res_local,d2,local_60,
               (ulong)close_dist._4_4_,dd);
      }
      if ((d2 <= d1) && (d1 <= (long)local_60)) {
        dVar6 = std::sqrt((double)(ulong)(uint)(fVar4 * fVar4 + fVar5 * fVar5));
        if ((SUB84(dVar6,0) < (float)_y) || (_y == 0)) {
          _y = (long)SUB84(dVar6,0);
        }
      }
    }
  }
  return _y;
}

Assistant:

long c_scan(long num, long degree, long res)
{
  assert(num >= 0 && num <= 3);
  struct robot *cur_robot = &robots[num];

  int i;

  float distance;
  long close_dist = 0L;
  float x, y;
  long d, dd, d1, d2;

  /* get degree of scan resolution, up to limit */
  // res = pop();
  if (res < 0L)
    res = 0L;
  else if (res > RES_LIMIT)
    res = RES_LIMIT;

  /* get scan direction */
  // degree = pop();
  if (degree < 0L)
    degree = -degree;
  if (degree >= 360L)
    degree %= 360L;

  cur_robot->scan = (int)degree; /* record scan for display */

  /* check other robots for +/- resolution */
  for (i = 0; i < MAXROBOTS; i++)
  {
    if (cur_robot == &robots[i] || robots[i].status == DEAD)
      continue; /* skip current or dead robots */
    /* find relative degree angle */
    x = (cur_robot->x / CLICK) - (robots[i].x / CLICK);
    y = (cur_robot->y / CLICK) - (robots[i].y / CLICK);
    if ((int)(x + 0.5) == 0)
      /* avoid division by zero */
      d = (robots[i].y > cur_robot->y) ? 90 : 270;
    else
    {
      if (robots[i].y < cur_robot->y)
      {
        if (robots[i].x > cur_robot->x)
          d = 360.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 4 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 3 */
      }
      else
      {
        if (robots[i].x > cur_robot->x)
          d = RAD_DEG * atan(y / x); /* relative quadrant 1 */
        else
          d = 180.0 + (RAD_DEG * atan(y / x)); /* relative quadrant 2 */
      }
    }

    /* find out if robot tested is within the scan resolution */
    if (degree > res && degree < 360 - res)
    {
      dd = degree;
      d1 = d - res;
      d2 = d + res;
    }
    else
    {
      /* on 0 and 360 boundary, bring back into linear resolution */
      dd = degree + 180;
      d1 = 180 + d - res;
      d2 = 180 + d + res;
    }

    if (r_debug)
      printf("\nscan: degree; %ld; bounds %ld, %ld; robot %d; deg %ld\n",
             degree, d1, d2, i, d);

    if (dd >= d1 && dd <= d2)
    {
      /* this robot is within scan, so get his distance */
      distance = sqrt((x * x) + (y * y));
      /* only get the closest distance, when two or more robots are in scan */
      if (distance < close_dist || close_dist == 0L)
        close_dist = distance;
    }
  }
  return ((long)close_dist);
}